

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O1

void __thiscall
TxConfirmStats::removeTx
          (TxConfirmStats *this,uint entryHeight,uint nBestSeenHeight,uint bucketindex,bool inBlock)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  pointer pvVar4;
  pointer piVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  Logger *pLVar9;
  pointer pvVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  uint blockIndex;
  uint bucketindex_local;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar12 = nBestSeenHeight - entryHeight;
  if (nBestSeenHeight == 0) {
    uVar12 = 0;
  }
  bucketindex_local = bucketindex;
  if ((int)uVar12 < 0) {
    pLVar9 = LogInstance();
    bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
    if (bVar8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
        ;
        source_file._M_len = 0x5f;
        logging_function._M_str = "removeTx";
        logging_function._M_len = 8;
        LogPrintFormatInternal<>
                  (logging_function,source_file,0x1e8,ESTIMATEFEE,Debug,
                   (ConstevalFormatString<0U>)0xfb9aac);
        return;
      }
      goto LAB_00988c5a;
    }
  }
  else {
    pvVar4 = (this->unconfTxs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = ((long)(this->unconfTxs).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555;
    if ((int)uVar12 < (int)uVar13) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar13;
      lVar11 = SUB168(ZEXT416(entryHeight) % auVar7,0);
      blockIndex = SUB164(ZEXT416(entryHeight) % auVar7,0);
      if (*(int *)(*(long *)&pvVar4[lVar11].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + (ulong)bucketindex * 4) < 1) {
        pLVar9 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
        if (bVar8) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
          ;
          source_file_00._M_len = 0x5f;
          logging_function_00._M_str = "removeTx";
          logging_function_00._M_len = 8;
          LogPrintFormatInternal<unsigned_int,unsigned_int>
                    (logging_function_00,source_file_00,0x1fa,ESTIMATEFEE,Debug,
                     (ConstevalFormatString<2U>)0xfb9b34,&blockIndex,&bucketindex_local);
        }
      }
      else {
        piVar1 = (int *)(*(long *)&pvVar4[lVar11].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + (ulong)bucketindex * 4);
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      piVar5 = (this->oldUnconfTxs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar5[bucketindex];
      if (iVar2 < 1) {
        pLVar9 = LogInstance();
        bVar8 = BCLog::Logger::WillLogCategoryLevel(pLVar9,ESTIMATEFEE,Debug);
        if (bVar8) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
          ;
          source_file_01._M_len = 0x5f;
          logging_function_01._M_str = "removeTx";
          logging_function_01._M_len = 8;
          LogPrintFormatInternal<unsigned_int>
                    (logging_function_01,source_file_01,0x1f1,ESTIMATEFEE,Debug,
                     (ConstevalFormatString<1U>)0xfb9ae6,&bucketindex_local);
        }
      }
      else {
        piVar5[bucketindex] = iVar2 + -1;
      }
    }
    if ((!inBlock) && (uVar3 = this->scale, uVar3 <= uVar12)) {
      if (uVar3 == 0) {
        __assert_fail("scale != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/policy/fees.cpp"
                      ,0x1fe,
                      "void TxConfirmStats::removeTx(unsigned int, unsigned int, unsigned int, bool)"
                     );
      }
      if (uVar3 <= uVar12) {
        pvVar10 = (this->failAvg).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = (long)(this->failAvg).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar10;
        uVar13 = 0;
        do {
          if ((lVar11 >> 3) * -0x5555555555555555 - uVar13 == 0) break;
          lVar6 = *(long *)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar6 + (ulong)bucketindex_local * 8) =
               *(double *)(lVar6 + (ulong)bucketindex_local * 8) + 1.0;
          uVar13 = uVar13 + 1;
          pvVar10 = pvVar10 + 1;
        } while (uVar13 < (ulong)uVar12 / (ulong)uVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00988c5a:
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::removeTx(unsigned int entryHeight, unsigned int nBestSeenHeight, unsigned int bucketindex, bool inBlock)
{
    //nBestSeenHeight is not updated yet for the new block
    int blocksAgo = nBestSeenHeight - entryHeight;
    if (nBestSeenHeight == 0)  // the BlockPolicyEstimator hasn't seen any blocks yet
        blocksAgo = 0;
    if (blocksAgo < 0) {
        LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, blocks ago is negative for mempool tx\n");
        return;  //This can't happen because we call this with our best seen height, no entries can have higher
    }

    if (blocksAgo >= (int)unconfTxs.size()) {
        if (oldUnconfTxs[bucketindex] > 0) {
            oldUnconfTxs[bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from >25 blocks,bucketIndex=%u already\n",
                     bucketindex);
        }
    }
    else {
        unsigned int blockIndex = entryHeight % unconfTxs.size();
        if (unconfTxs[blockIndex][bucketindex] > 0) {
            unconfTxs[blockIndex][bucketindex]--;
        } else {
            LogDebug(BCLog::ESTIMATEFEE, "Blockpolicy error, mempool tx removed from blockIndex=%u,bucketIndex=%u already\n",
                     blockIndex, bucketindex);
        }
    }
    if (!inBlock && (unsigned int)blocksAgo >= scale) { // Only counts as a failure if not confirmed for entire period
        assert(scale != 0);
        unsigned int periodsAgo = blocksAgo / scale;
        for (size_t i = 0; i < periodsAgo && i < failAvg.size(); i++) {
            failAvg[i][bucketindex]++;
        }
    }
}